

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sqrtf.h
# Opt level: O1

float sqrtf_10(float x)

{
  bool bVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  
  fVar3 = x * 0.5;
  fVar4 = fVar3;
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    do {
      do {
        fVar3 = (x / fVar4 + fVar4) * 0.5;
        bVar1 = NAN(fVar4);
        bVar2 = fVar3 != fVar4;
        fVar4 = fVar3;
      } while (bVar2);
    } while (NAN(fVar3) || bVar1);
  }
  return fVar3;
}

Assistant:

float sqrtf_10(const float x)
{
    float n = x / 2.0;
    float lstX = 0.0;
    while (n != lstX)
    {
        lstX = n;
        n = (n + x / n) / 2.0;
    }
    return n;
}